

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer::ConvertOne
          (ParsedFormatConsumer *this,UnboundConversion *conv,string_view s)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ConversionItem local_38;
  
  memcpy(this->data_pos,s._M_str,s._M_len);
  pcVar1 = this->data_pos;
  this->data_pos = pcVar1 + s._M_len;
  local_38.text_end =
       (long)(pcVar1 + s._M_len) -
       (long)(this->parsed->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
             _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_38.is_conversion = true;
  uVar2._0_4_ = conv->arg_position;
  uVar2._4_4_ = conv->width;
  uVar3 = *(undefined8 *)((long)&(conv->width).value_ + 3);
  local_38.conv._0_7_ = SUB87(uVar2,0);
  local_38.conv.width.value_._3_1_ = (undefined1)uVar3;
  local_38.conv._8_7_ = SUB87((ulong)uVar3 >> 8,0);
  std::
  vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  ::emplace_back<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>
            (&this->parsed->items_,&local_38);
  return true;
}

Assistant:

bool ConvertOne(const UnboundConversion &conv, string_view s) {
    size_t text_end = AppendText(s);
    parsed->items_.push_back({true, text_end, conv});
    return true;
  }